

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqr_test.cpp
# Opt level: O2

void __thiscall SqrTest_sampleTest_Test::TestBody(SqrTest_sampleTest_Test *this)

{
  char *message;
  AssertHelper local_30;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  AssertionResult gtest_ar;
  
  local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x19;
  local_30.data_ = (AssertHelperData *)sqr(5);
  testing::internal::CmpHelperEQ<unsigned_long_long,unsigned_long_long>
            ((internal *)&gtest_ar,"25ull","sqr(5)",(unsigned_long_long *)&local_28,
             (unsigned_long_long *)&local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/chunmeng[P]cmake-project-base/test/sqr_test.cpp"
               ,0xc,message);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(SqrTest, sampleTest)
{
    EXPECT_EQ(25ull, sqr(5));
}